

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_opl.cpp
# Opt level: O0

ssize_t __thiscall ymfm::opll_registers::write(opll_registers *this,int __fd,void *__buf,size_t __n)

{
  ushort uVar1;
  byte bVar2;
  uint32_t *puVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t *in_R8;
  uint32_t local_3c;
  uint32_t *opmask_local;
  uint32_t *channel_local;
  uint8_t data_local;
  uint16_t index_local;
  opll_registers *this_local;
  
  bVar2 = (byte)__buf;
  uVar1 = (ushort)__fd;
  if (uVar1 < 0x40) {
    this->m_regdata[uVar1] = bVar2;
    if (uVar1 == 0xe) {
      *(undefined4 *)__n = 0xff;
      uVar4 = bitfield((uint)bVar2,5,1);
      if (uVar4 == 0) {
        local_3c = 0;
      }
      else {
        local_3c = bitfield((uint)bVar2,0,5);
      }
      *in_R8 = local_3c;
      this_local._7_1_ = 1;
    }
    else {
      puVar3 = (uint32_t *)0x0;
      if (((__fd & 0xf0U) == 0x20) &&
         (*(uint *)__n = __fd & 0xf, puVar3 = (uint32_t *)__n, *(uint *)__n < 9)) {
        uVar5 = bitfield((uint)bVar2,4,1);
        uVar4 = 0;
        if (uVar5 != 0) {
          uVar4 = 3;
        }
        *in_R8 = uVar4;
        this_local._7_1_ = 1;
      }
      else {
        in_R8 = puVar3;
        this_local._7_1_ = 0;
      }
    }
  }
  else {
    this_local._7_1_ = 0;
    in_R8 = (uint32_t *)(ulong)uVar1;
  }
  return CONCAT71((int7)((ulong)in_R8 >> 8),this_local._7_1_);
}

Assistant:

bool opll_registers::write(uint16_t index, uint8_t data, uint32_t &channel, uint32_t &opmask)
{
	// unclear the address is masked down to 6 bits or if writes above
	// the register top are ignored; assuming the latter for now
	if (index >= REGISTERS)
		return false;

	// write the new data
	m_regdata[index] = data;

	// handle writes to the rhythm keyons
	if (index == 0x0e)
	{
		channel = RHYTHM_CHANNEL;
		opmask = bitfield(data, 5) ? bitfield(data, 0, 5) : 0;
		return true;
	}

	// handle writes to the channel keyons
	if ((index & 0xf0) == 0x20)
	{
		channel = index & 0x0f;
		if (channel < CHANNELS)
		{
			opmask = bitfield(data, 4) ? 3 : 0;
			return true;
		}
	}
	return false;
}